

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgSmallDeterminant.cpp
# Opt level: O3

dgGoogol * Determinant4x4(dgGoogol *__return_storage_ptr__,dgGoogol (*matrix) [4])

{
  undefined8 *puVar1;
  dgGoogol *pdVar2;
  undefined8 uVar3;
  HaU64 HVar4;
  HaU64 HVar5;
  HaU64 HVar6;
  dgGoogol (*padVar7) [4];
  HaI32 j;
  long lVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  dgGoogol sign;
  dgGoogol negOne;
  dgGoogol accError;
  dgGoogol minorDet;
  dgGoogol cofactor [3] [3];
  dgGoogol local_2b8;
  dgGoogol local_288;
  dgGoogol local_260;
  dgGoogol local_238;
  dgGoogol local_210;
  dgGoogol local_1e8;
  dgGoogol local_1c0;
  dgGoogol local_198 [9];
  
  dgGoogol::dgGoogol(&local_2b8,1.0);
  dgGoogol::dgGoogol(__return_storage_ptr__,0.0);
  dgGoogol::dgGoogol(&local_260,-1.0);
  dgGoogol::dgGoogol(&local_210,0.0);
  lVar9 = 0;
  lVar12 = 0;
  do {
    lVar11 = 0;
    do {
      dgGoogol::dgGoogol((dgGoogol *)((long)local_198[0].m_mantissa + lVar11 + -8));
      lVar11 = lVar11 + 0x28;
    } while (lVar11 != 0x168);
    lVar11 = 0;
    padVar7 = matrix;
    do {
      lVar8 = 0;
      iVar10 = 0;
      do {
        if (lVar9 != lVar8) {
          local_198[lVar11 * 3 + (long)iVar10].m_mantissa[3] =
               *(HaU64 *)((long)(*padVar7)[0].m_mantissa + lVar8 + 0x18);
          puVar1 = (undefined8 *)((long)(*padVar7)[0].m_mantissa + lVar8 + -8);
          uVar3 = *puVar1;
          HVar4 = puVar1[1];
          HVar5 = puVar1[2];
          HVar6 = puVar1[3];
          pdVar2 = local_198 + lVar11 * 3 + (long)iVar10;
          pdVar2->m_sign = (char)uVar3;
          pdVar2->field_0x1 = (char)((ulong)uVar3 >> 8);
          pdVar2->m_exponent = (short)((ulong)uVar3 >> 0x10);
          *(int *)&pdVar2->field_0x4 = (int)((ulong)uVar3 >> 0x20);
          pdVar2->m_mantissa[0] = HVar4;
          pdVar2->m_mantissa[1] = HVar5;
          pdVar2->m_mantissa[2] = HVar6;
          iVar10 = iVar10 + 1;
        }
        lVar8 = lVar8 + 0x28;
      } while (lVar8 != 0xa0);
      lVar11 = lVar11 + 1;
      padVar7 = padVar7 + 1;
    } while (lVar11 != 3);
    Determinant3x3(&local_1c0,(dgGoogol (*) [3])local_198);
    dgGoogol::operator*(&local_238,&local_2b8,&local_1c0);
    dgGoogol::operator*(&local_1e8,&local_238,matrix[3] + lVar12);
    dgGoogol::operator+(&local_288,__return_storage_ptr__,&local_1e8);
    __return_storage_ptr__->m_mantissa[3] = local_288.m_mantissa[3];
    __return_storage_ptr__->m_sign = local_288.m_sign;
    __return_storage_ptr__->field_0x1 = local_288._1_1_;
    __return_storage_ptr__->m_exponent = local_288.m_exponent;
    *(undefined4 *)&__return_storage_ptr__->field_0x4 = local_288._4_4_;
    __return_storage_ptr__->m_mantissa[0] = local_288.m_mantissa[0];
    __return_storage_ptr__->m_mantissa[1] = local_288.m_mantissa[1];
    __return_storage_ptr__->m_mantissa[2] = local_288.m_mantissa[2];
    dgGoogol::~dgGoogol(&local_288);
    dgGoogol::~dgGoogol(&local_1e8);
    dgGoogol::~dgGoogol(&local_238);
    dgGoogol::operator*(&local_288,&local_2b8,&local_260);
    local_2b8.m_mantissa[3] = local_288.m_mantissa[3];
    local_2b8.m_sign = local_288.m_sign;
    local_2b8._1_1_ = local_288._1_1_;
    local_2b8.m_exponent = local_288.m_exponent;
    local_2b8._4_4_ = local_288._4_4_;
    local_2b8.m_mantissa[0] = local_288.m_mantissa[0];
    local_2b8.m_mantissa[1] = local_288.m_mantissa[1];
    local_2b8.m_mantissa[2] = local_288.m_mantissa[2];
    dgGoogol::~dgGoogol(&local_288);
    dgGoogol::~dgGoogol(&local_1c0);
    lVar11 = 0x140;
    do {
      dgGoogol::~dgGoogol((dgGoogol *)((long)local_198[0].m_mantissa + lVar11 + -8));
      lVar11 = lVar11 + -0x28;
    } while (lVar11 != -0x28);
    lVar12 = lVar12 + 1;
    lVar9 = lVar9 + 0x28;
  } while (lVar12 != 4);
  dgGoogol::~dgGoogol(&local_210);
  dgGoogol::~dgGoogol(&local_260);
  dgGoogol::~dgGoogol(&local_2b8);
  return __return_storage_ptr__;
}

Assistant:

dgGoogol Determinant4x4 (const dgGoogol matrix[4][4])
{
	dgGoogol sign = hacd::HaF64 (1.0f);
	dgGoogol det = hacd::HaF64 (0.0f);
	dgGoogol negOne (hacd::HaF64 (-1.0f));
	dgGoogol accError = hacd::HaF64 (0.0f); 
	for (hacd::HaI32 i = 0; i < 4; i ++)  {
		dgGoogol  cofactor[3][3];
		for (hacd::HaI32 j = 0; j < 3; j ++) {
			hacd::HaI32 k0 = 0;
			for (hacd::HaI32 k = 0; k < 4; k ++) {
				if (k != i) {
					cofactor[j][k0] = matrix[j][k];
					k0 ++;
				}
			}
		}

		dgGoogol minorDet = Determinant3x3 (cofactor);
		det = det + sign * minorDet * matrix[3][i];
		sign = sign * negOne;
	}
	return det;
}